

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypeFileInput.cpp
# Opt level: O3

EStatusCode __thiscall OpenTypeFileInput::ReadHMtx(OpenTypeFileInput *this)

{
  _Rb_tree_header *p_Var1;
  OpenTypePrimitiveReader *this_00;
  ushort uVar2;
  EStatusCode EVar3;
  unsigned_long uVar4;
  Trace *this_01;
  HMtxTable pHVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  long lVar8;
  ulong uVar9;
  
  uVar4 = GetTag(this,"hmtx");
  p_Var7 = (this->mTables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 != (_Base_ptr)0x0) {
    p_Var1 = &(this->mTables)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var7 + 1) >= uVar4) {
        p_Var6 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[*(ulong *)(p_Var7 + 1) < uVar4];
    } while (p_Var7 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (*(ulong *)(p_Var6 + 1) <= uVar4)) {
      this_00 = &this->mPrimitivesReader;
      OpenTypePrimitiveReader::SetOffset(this_00,(LongFilePositionType)p_Var6[1]._M_left);
      uVar2 = (this->mMaxp).NumGlyphs;
      pHVar5 = (HMtxTable)operator_new__((ulong)((uint)uVar2 * 4));
      this->mHMtx = pHVar5;
      if ((this->mHHea).NumberOfHMetrics == 0) {
        uVar9 = 0;
      }
      else {
        lVar8 = 0;
        uVar9 = 0;
        do {
          OpenTypePrimitiveReader::ReadUSHORT
                    (this_00,(unsigned_short *)((long)&this->mHMtx->AdvanceWidth + lVar8));
          OpenTypePrimitiveReader::ReadSHORT
                    (this_00,(short *)((long)&this->mHMtx->LeftSideBearing + lVar8));
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 4;
        } while (uVar9 < (this->mHHea).NumberOfHMetrics);
        uVar2 = (this->mMaxp).NumGlyphs;
      }
      if ((uint)uVar9 < (uint)uVar2) {
        uVar9 = uVar9 & 0xffffffff;
        lVar8 = uVar9 * 4 + 2;
        do {
          pHVar5 = this->mHMtx;
          pHVar5[uVar9].AdvanceWidth =
               pHVar5[(ulong)(this->mHHea).NumberOfHMetrics - 1].AdvanceWidth;
          OpenTypePrimitiveReader::ReadSHORT(this_00,(short *)((long)&pHVar5->AdvanceWidth + lVar8))
          ;
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 4;
        } while (uVar9 < (this->mMaxp).NumGlyphs);
      }
      EVar3 = OpenTypePrimitiveReader::GetInternalState(this_00);
      return EVar3;
    }
  }
  this_01 = Trace::DefaultTrace();
  Trace::TraceToLog(this_01,"OpenTypeFileInput::ReadHMtx, could not find hmtx table");
  return eFailure;
}

Assistant:

EStatusCode OpenTypeFileInput::ReadHMtx()
{
	ULongToTableEntryMap::iterator it = mTables.find(GetTag("hmtx"));
	if(it == mTables.end())
	{
		TRACE_LOG("OpenTypeFileInput::ReadHMtx, could not find hmtx table");
		return PDFHummus::eFailure;
	}

	mPrimitivesReader.SetOffset(it->second.Offset);

	mHMtx = new HMtxTableEntry[mMaxp.NumGlyphs];

	unsigned int i=0;

	for(; i < mHHea.NumberOfHMetrics;++i)
	{
		mPrimitivesReader.ReadUSHORT(mHMtx[i].AdvanceWidth);
		mPrimitivesReader.ReadSHORT(mHMtx[i].LeftSideBearing);
	}

	for(; i < mMaxp.NumGlyphs; ++i)
	{
		mHMtx[i].AdvanceWidth = mHMtx[mHHea.NumberOfHMetrics-1].AdvanceWidth;
		mPrimitivesReader.ReadSHORT(mHMtx[i].LeftSideBearing);
	}

	return mPrimitivesReader.GetInternalState();	
}